

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__resample_horizontal_gather
               (stbir__info *stbir_info,float *output_buffer,float *input_buffer)

{
  float fVar1;
  
  if ((((stbir_info->horizontal).filter_enum == STBIR_FILTER_POINT_SAMPLE) &&
      (fVar1 = (stbir_info->horizontal).scale_info.scale, fVar1 == 1.0)) && (!NAN(fVar1))) {
    stbir_simd_memcpy(output_buffer,input_buffer,
                      (long)stbir_info->effective_channels *
                      (long)(stbir_info->horizontal).scale_info.output_sub_size * 4);
    return;
  }
  (*stbir_info->horizontal_gather_channels)
            (output_buffer,(stbir_info->horizontal).scale_info.output_sub_size,
             input_buffer +
             -((long)stbir_info->effective_channels *
              (long)(stbir_info->scanline_extents).conservative.n0),
             (stbir_info->horizontal).contributors,(stbir_info->horizontal).coefficients,
             (stbir_info->horizontal).coefficient_width);
  return;
}

Assistant:

static void stbir__resample_horizontal_gather(stbir__info const * stbir_info, float* output_buffer, float const * input_buffer STBIR_ONLY_PROFILE_GET_SPLIT_INFO )
{
  float const * decode_buffer = input_buffer - ( stbir_info->scanline_extents.conservative.n0 * stbir_info->effective_channels );

  STBIR_PROFILE_START( horizontal );
  if ( ( stbir_info->horizontal.filter_enum == STBIR_FILTER_POINT_SAMPLE ) && ( stbir_info->horizontal.scale_info.scale == 1.0f ) )
    STBIR_MEMCPY( output_buffer, input_buffer, stbir_info->horizontal.scale_info.output_sub_size * sizeof( float ) * stbir_info->effective_channels );
  else
    stbir_info->horizontal_gather_channels( output_buffer, stbir_info->horizontal.scale_info.output_sub_size, decode_buffer, stbir_info->horizontal.contributors, stbir_info->horizontal.coefficients, stbir_info->horizontal.coefficient_width );
  STBIR_PROFILE_END( horizontal );
}